

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  ImFontConfig *pIVar1;
  ImFont **ppIVar2;
  void *pvVar3;
  undefined8 *in_RSI;
  ImFont *in_RDI;
  ImFontConfig *new_font_cfg;
  ImFontConfig *in_stack_ffffffffffffff98;
  ImFontAtlas *in_stack_ffffffffffffffa0;
  
  if ((*(byte *)(in_RSI + 9) & 1) == 0) {
    in_stack_ffffffffffffffa0 = (ImFontAtlas *)&in_RDI->ConfigData;
    ImGui::MemAlloc((size_t)in_stack_ffffffffffffffa0);
    ::operator_new(0x70);
    ImFont::ImFont(in_RDI);
    ImVector<ImFont_*>::push_back
              ((ImVector<ImFont_*> *)in_stack_ffffffffffffffa0,(ImFont **)in_stack_ffffffffffffff98)
    ;
  }
  ImVector<ImFontConfig>::push_back
            ((ImVector<ImFontConfig> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pIVar1 = ImVector<ImFontConfig>::back((ImVector<ImFontConfig> *)&in_RDI->MetricsTotalSurface);
  if (pIVar1->DstFont == (ImFont *)0x0) {
    ppIVar2 = ImVector<ImFont_*>::back((ImVector<ImFont_*> *)&in_RDI->ConfigData);
    pIVar1->DstFont = *ppIVar2;
  }
  if ((pIVar1->FontDataOwnedByAtlas & 1U) == 0) {
    pvVar3 = ImGui::MemAlloc((size_t)in_stack_ffffffffffffffa0);
    pIVar1->FontData = pvVar3;
    pIVar1->FontDataOwnedByAtlas = true;
    memcpy(pIVar1->FontData,(void *)*in_RSI,(long)pIVar1->FontDataSize);
  }
  if (pIVar1->DstFont->EllipsisChar == 0xffff) {
    pIVar1->DstFont->EllipsisChar = *(ImWchar *)((long)in_RSI + 0x54);
  }
  *(undefined1 *)((long)&(in_RDI->IndexLookup).Size + 1) = 0;
  ClearTexData(in_stack_ffffffffffffffa0);
  return pIVar1->DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    // Invalidate texture
    TexReady = false;
    ClearTexData();
    return new_font_cfg.DstFont;
}